

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::KeywordTypeSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x180) {
    if ((kind != CHandleType) && (kind != EventType)) {
      return false;
    }
  }
  else if ((((0x3d < kind - PropertyType) ||
            ((0x200001200000c001U >> ((ulong)(kind - PropertyType) & 0x3f) & 1) == 0)) &&
           (kind != Untyped)) && (kind != VoidType)) {
    return false;
  }
  return true;
}

Assistant:

bool KeywordTypeSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CHandleType:
        case SyntaxKind::EventType:
        case SyntaxKind::PropertyType:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::RealType:
        case SyntaxKind::SequenceType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::StringType:
        case SyntaxKind::Untyped:
        case SyntaxKind::VoidType:
            return true;
        default:
            return false;
    }
}